

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTree.cpp
# Opt level: O0

void __thiscall DTree::DTree(DTree *this,string *fileName)

{
  string *in_RSI;
  string *in_stack_000006a8;
  DTree *in_stack_000006b0;
  string local_30 [8];
  DTreeNode *in_stack_ffffffffffffffd8;
  DTree *in_stack_ffffffffffffffe0;
  
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)0x1bfa3a);
  std::vector<DTreeNode_*,_std::allocator<DTreeNode_*>_>::vector
            ((vector<DTreeNode_*,_std::allocator<DTreeNode_*>_> *)0x1bfa4d);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *)0x1bfa60);
  std::__cxx11::string::string(local_30,in_RSI);
  buildFromFile(in_stack_000006b0,in_stack_000006a8);
  std::__cxx11::string::~string(local_30);
  extendDTree(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

DTree::DTree(string fileName)
{
	buildFromFile(fileName);
	extendDTree(_root);
}